

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb_fastpforlib::internal::__fastpack21(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  
  uVar1 = in[1];
  *out = uVar1 << 0x15 | *in & 0x1fffff;
  out[1] = (in[2] & 0x1fffff) << 10 | uVar1 >> 0xb & 0x3ff;
  Unroller<(unsigned_short)21,_(unsigned_short)3>::Pack(in,out + 1);
  return;
}

Assistant:

void __fastpack21(const uint32_t *__restrict in, uint32_t *__restrict out) {
	Unroller<21>::Pack(in, out);
}